

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O0

void __thiscall KeyData_Privkey_mainnet_Test::TestBody(KeyData_Privkey_mainnet_Test *this)

{
  allocator<unsigned_int> *this_00;
  initializer_list<unsigned_int> __l;
  allocator local_5c1;
  string local_5c0;
  undefined1 local_5a0 [8];
  KeyData obj3;
  KeyData obj2;
  string local_288;
  undefined1 local_268 [8];
  KeyData obj1;
  anon_class_1_0_00000001 check_func;
  undefined1 local_c0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  string local_a0;
  undefined1 local_80 [8];
  ByteData fingerprint1;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey privkey1;
  KeyData_Privkey_mainnet_Test *this_local;
  
  privkey1._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"KxqjPLtQqydD8d6eUrpJ7Q1266k8Mw8f5eoyEztY3Kc5z4f2RQTG",&local_51);
  cfd::core::Privkey::FromWif((Privkey *)local_30,&local_50,kCustomChain,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"3456789a",
             (allocator *)
             ((long)&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&array1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  obj1.fingerprint_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x80000001;
  this_00 = (allocator<unsigned_int> *)
            ((long)&obj1.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = 3;
  __l._M_array = (iterator)
                 ((long)&obj1.fingerprint_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,__l,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_288,"1\'/2/0x80000003",
             (allocator *)
             ((long)&obj2.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::KeyData::KeyData
            ((KeyData *)local_268,(Privkey *)local_30,&local_288,(ByteData *)local_80);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&obj2.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2),(KeyData *)local_268,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
  cfd::core::KeyData::KeyData
            ((KeyData *)
             &obj3.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Privkey *)local_30,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,(ByteData *)local_80);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2),
             (KeyData *)
             &obj3.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c0,"1h/2/3H",&local_5c1);
  cfd::core::KeyData::KeyData
            ((KeyData *)local_5a0,(Privkey *)local_30,&local_5c0,(ByteData *)local_80);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2),(KeyData *)local_5a0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
  cfd::core::KeyData::~KeyData((KeyData *)local_5a0);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &obj3.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::~KeyData((KeyData *)local_268);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0);
  cfd::core::ByteData::~ByteData((ByteData *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(KeyData, Privkey_mainnet) {
  Privkey privkey1 = Privkey::FromWif("KxqjPLtQqydD8d6eUrpJ7Q1266k8Mw8f5eoyEztY3Kc5z4f2RQTG");
  ByteData fingerprint1("3456789a");
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_TRUE(obj.HasPrivkey());
    EXPECT_FALSE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "KxqjPLtQqydD8d6eUrpJ7Q1266k8Mw8f5eoyEztY3Kc5z4f2RQTG",
        obj.GetPrivkey().GetWif().c_str());
    EXPECT_STREQ(
        "031777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3']031777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h]KxqjPLtQqydD8d6eUrpJ7Q1266k8Mw8f5eoyEztY3Kc5z4f2RQTG",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1(privkey1, "1'/2/0x80000003", fingerprint1);
  check_func(obj1, array1);
  KeyData obj2(privkey1, array1, fingerprint1);
  check_func(obj2, array1);
  KeyData obj3(privkey1, "1h/2/3H", fingerprint1);
  check_func(obj3, array1);
}